

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O0

bool __thiscall cmsys::Glob::FindFiles(Glob *this,string *inexpr,GlobMessages *messages)

{
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  bool collapse;
  allocator<char> local_171;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  int local_10c;
  string local_108 [4];
  int ch;
  size_type local_e8;
  size_type last_slash;
  size_type skip;
  string fexpr;
  string local_98;
  undefined1 local_68 [8];
  string expr;
  size_type cc;
  string cexpr;
  GlobMessages *messages_local;
  string *inexpr_local;
  Glob *this_local;
  
  cexpr.field_2._8_8_ = messages;
  std::__cxx11::string::string((string *)&cc);
  std::__cxx11::string::string((string *)local_68,(string *)inexpr);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
            (&this->Internals->Expressions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->Internals->Files);
  bVar2 = SystemTools::FileIsFullPath((string *)local_68);
  if (!bVar2) {
    SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_98,(SystemTools *)0x1,collapse);
    std::__cxx11::string::operator=((string *)local_68,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&fexpr.field_2 + 8),"/",inexpr);
    std::__cxx11::string::operator+=((string *)local_68,(string *)(fexpr.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(fexpr.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::string((string *)&skip,(string *)local_68);
  last_slash = 0;
  local_e8 = 0;
  for (expr.field_2._8_8_ = 0; uVar1 = expr.field_2._8_8_, uVar3 = std::__cxx11::string::size(),
      (ulong)uVar1 < uVar3; expr.field_2._8_8_ = expr.field_2._8_8_ + 1) {
    if (((expr.field_2._8_8_ != 0) &&
        (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_68), *pcVar4 == '/')) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_68), *pcVar4 != '\\')) {
      local_e8 = expr.field_2._8_8_;
    }
    if ((expr.field_2._8_8_ != 0) &&
       ((((pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_68), *pcVar4 == '[' ||
          (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_68), *pcVar4 == '?')) ||
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_68), *pcVar4 == '*')) &&
        (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_68), *pcVar4 != '\\'))))
    break;
  }
  if (local_e8 != 0) {
    last_slash = local_e8;
  }
  if (((last_slash == 0) &&
      (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_68), *pcVar4 == ':')) &&
     (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_68), *pcVar4 != '/')) {
    last_slash = 2;
  }
  if (last_slash != 0) {
    std::__cxx11::string::substr((ulong)local_108,(ulong)local_68);
    std::__cxx11::string::operator=((string *)local_68,local_108);
    std::__cxx11::string::~string(local_108);
  }
  std::__cxx11::string::operator=((string *)&cc,"");
  for (expr.field_2._8_8_ = 0; uVar1 = expr.field_2._8_8_, uVar3 = std::__cxx11::string::size(),
      (ulong)uVar1 < uVar3; expr.field_2._8_8_ = expr.field_2._8_8_ + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_68);
    local_10c = (int)*pcVar4;
    if (local_10c == 0x2f) {
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        AddExpression(this,(string *)&cc);
      }
      std::__cxx11::string::operator=((string *)&cc,"");
    }
    else {
      std::__cxx11::string::append((ulong)&cc,'\x01');
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    AddExpression(this,(string *)&cc);
  }
  if (last_slash == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"/",&local_171);
    ProcessDirectory(this,0,&local_170,(GlobMessages *)cexpr.field_2._8_8_);
    std::__cxx11::string::~string((string *)&local_170);
    std::allocator<char>::~allocator(&local_171);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_150,(ulong)&skip);
    std::operator+(&local_130,&local_150,"/");
    ProcessDirectory(this,0,&local_130,(GlobMessages *)cexpr.field_2._8_8_);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
  }
  std::__cxx11::string::~string((string *)&skip);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)&cc);
  return true;
}

Assistant:

bool Glob::FindFiles(const std::string& inexpr, GlobMessages* messages)
{
  std::string cexpr;
  std::string::size_type cc;
  std::string expr = inexpr;

  this->Internals->Expressions.clear();
  this->Internals->Files.clear();

  if (!kwsys::SystemTools::FileIsFullPath(expr)) {
    expr = kwsys::SystemTools::GetCurrentWorkingDirectory();
    expr += "/" + inexpr;
  }
  std::string fexpr = expr;

  std::string::size_type skip = 0;
  std::string::size_type last_slash = 0;
  for (cc = 0; cc < expr.size(); cc++) {
    if (cc > 0 && expr[cc] == '/' && expr[cc - 1] != '\\') {
      last_slash = cc;
    }
    if (cc > 0 && (expr[cc] == '[' || expr[cc] == '?' || expr[cc] == '*') &&
        expr[cc - 1] != '\\') {
      break;
    }
  }
  if (last_slash > 0) {
    // std::cout << "I can skip: " << fexpr.substr(0, last_slash)
    // << std::endl;
    skip = last_slash;
  }
  if (skip == 0) {
#if defined(KWSYS_GLOB_SUPPORT_NETWORK_PATHS)
    // Handle network paths
    if (expr[0] == '/' && expr[1] == '/') {
      int cnt = 0;
      for (cc = 2; cc < expr.size(); cc++) {
        if (expr[cc] == '/') {
          cnt++;
          if (cnt == 2) {
            break;
          }
        }
      }
      skip = int(cc + 1);
    } else
#endif
      // Handle drive letters on Windows
      if (expr[1] == ':' && expr[0] != '/') {
      skip = 2;
    }
  }

  if (skip > 0) {
    expr = expr.substr(skip);
  }

  cexpr = "";
  for (cc = 0; cc < expr.size(); cc++) {
    int ch = expr[cc];
    if (ch == '/') {
      if (!cexpr.empty()) {
        this->AddExpression(cexpr);
      }
      cexpr = "";
    } else {
      cexpr.append(1, static_cast<char>(ch));
    }
  }
  if (!cexpr.empty()) {
    this->AddExpression(cexpr);
  }

  // Handle network paths
  if (skip > 0) {
    this->ProcessDirectory(0, fexpr.substr(0, skip) + "/", messages);
  } else {
    this->ProcessDirectory(0, "/", messages);
  }
  return true;
}